

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O0

UnblindOutputStruct *
cfd::js::api::ElementsTransactionStructApi::GetUnblindData
          (UnblindOutputStruct *__return_storage_ptr__,GetUnblindDataRequestStruct *request)

{
  GetUnblindDataRequestStruct *this;
  string *in_R8;
  allocator local_179;
  function<cfd::js::api::UnblindOutputStruct_(const_cfd::js::api::GetUnblindDataRequestStruct_&)>
  local_178;
  undefined1 local_158 [318];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  GetUnblindDataRequestStruct *pGStack_18;
  anon_class_1_0_00000001 call_func;
  GetUnblindDataRequestStruct *request_local;
  UnblindOutputStruct *result;
  
  local_1a = 0;
  pGStack_18 = request;
  UnblindOutputStruct::UnblindOutputStruct(__return_storage_ptr__);
  this = pGStack_18;
  std::function<cfd::js::api::UnblindOutputStruct(cfd::js::api::GetUnblindDataRequestStruct_const&)>
  ::
  function<cfd::js::api::ElementsTransactionStructApi::GetUnblindData(cfd::js::api::GetUnblindDataRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::UnblindOutputStruct(cfd::js::api::GetUnblindDataRequestStruct_const&)>
              *)local_158,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"GetUnblindData",&local_179);
  ExecuteStructApi<cfd::js::api::GetUnblindDataRequestStruct,cfd::js::api::UnblindOutputStruct>
            ((UnblindOutputStruct *)(local_158 + 0x20),(api *)this,
             (GetUnblindDataRequestStruct *)local_158,&local_178,in_R8);
  UnblindOutputStruct::operator=(__return_storage_ptr__,(UnblindOutputStruct *)(local_158 + 0x20));
  UnblindOutputStruct::~UnblindOutputStruct((UnblindOutputStruct *)(local_158 + 0x20));
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::
  function<cfd::js::api::UnblindOutputStruct_(const_cfd::js::api::GetUnblindDataRequestStruct_&)>::
  ~function((function<cfd::js::api::UnblindOutputStruct_(const_cfd::js::api::GetUnblindDataRequestStruct_&)>
             *)local_158);
  return __return_storage_ptr__;
}

Assistant:

UnblindOutputStruct ElementsTransactionStructApi::GetUnblindData(
    const GetUnblindDataRequestStruct& request) {
  auto call_func = [](const GetUnblindDataRequestStruct& request)
      -> UnblindOutputStruct {  // NOLINT
    UnblindOutputStruct response;
    Script locking_script_obj(request.locking_script);
    ConfidentialAssetId asset_obj(request.asset_commitment);
    ConfidentialValue value(request.value_commitment);
    ConfidentialNonce nonce(request.commitment_nonce);
    ByteData rangeproof_obj(request.rangeproof);
    Privkey blinding_key_obj = Privkey::HasWif(request.blinding_key)
                                   ? Privkey::FromWif(request.blinding_key)
                                   : Privkey(request.blinding_key);
    ConfidentialTxOut txout(
        locking_script_obj, asset_obj, value, nonce, ByteData(),
        rangeproof_obj);
    auto unblind_data = txout.Unblind(blinding_key_obj);

    response.amount = unblind_data.value.GetAmount().GetSatoshiValue();
    response.asset = unblind_data.asset.GetHex();
    response.blind_factor = unblind_data.vbf.GetHex();
    response.asset_blind_factor = unblind_data.abf.GetHex();
    return response;
  };

  UnblindOutputStruct result;
  result = ExecuteStructApi<GetUnblindDataRequestStruct, UnblindOutputStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}